

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O2

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  long *plVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  CURLcode CVar4;
  ulong in_RAX;
  undefined8 uVar5;
  CURLcode *pCVar6;
  undefined8 uVar7;
  CURLcode *pCVar8;
  bool bVar9;
  _Bool bdone;
  undefined8 uStack_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pCVar8 = (CURLcode *)cf->ctx;
    pCVar6 = pCVar8 + 0x16;
    uStack_38 = in_RAX;
    for (uVar7 = CURLE_OK; uVar5 = *(undefined8 *)(pCVar8 + 0x26), (ulong)uVar7 < (ulong)uVar5;
        uVar7 = uVar7 + CURLE_UNSUPPORTED_PROTOCOL) {
      uStack_38 = uStack_38 & 0xffffffffffffff;
      plVar1 = *(long **)(pCVar6 + -10);
      if (((plVar1 != (long *)0x0) && (pCVar6[-8] == CURLE_OK)) &&
         ((*pCVar6 & CURLE_UNSUPPORTED_PROTOCOL) == CURLE_OK)) {
        CVar4 = (**(code **)(*plVar1 + 0x28))(plVar1,data,(long)&uStack_38 + 7);
        pCVar6[-8] = CVar4;
        if ((CVar4 != CURLE_OK) || (uStack_38._7_1_ == '\x01')) {
          *(undefined1 *)pCVar6 = (char)*pCVar6 | CURLE_UNSUPPORTED_PROTOCOL;
        }
      }
      pCVar6 = pCVar6 + 0xe;
    }
    *done = true;
    pCVar6 = pCVar8 + 0x16;
    bVar3 = true;
    uVar7 = uVar5;
    while (bVar9 = uVar7 != CURLE_OK, uVar7 = uVar7 - CURLE_UNSUPPORTED_PROTOCOL, bVar9) {
      if ((*pCVar6 & CURLE_UNSUPPORTED_PROTOCOL) == CURLE_OK) {
        *done = false;
        bVar3 = false;
      }
      pCVar6 = pCVar6 + 0xe;
    }
    CVar4 = CURLE_OK;
    if (bVar3) {
      CVar4 = CURLE_OK;
      while( true ) {
        pCVar8 = pCVar8 + 0xe;
        bVar9 = uVar5 == CURLE_OK;
        uVar5 = uVar5 - CURLE_UNSUPPORTED_PROTOCOL;
        if (bVar9) break;
        if (*pCVar8 != CURLE_OK) {
          CVar4 = *pCVar8;
        }
      }
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x897 & 0x40) != 0)) {
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar4;
        }
      }
      else {
        if (cf == (Curl_cfilter *)0x0) {
          return CVar4;
        }
        if (pcVar2->log_level < 1) {
          return CVar4;
        }
      }
      if (0 < cf->cft->log_level) {
        Curl_trc_cf_infof(data,cf,"shutdown -> %d, done=%d",(ulong)CVar4,(ulong)bVar3);
      }
    }
  }
  else {
    *done = true;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  for(i = 0; i < ctx->baller_count; i++) {
    struct cf_hc_baller *b = &ctx->ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < ctx->baller_count; i++) {
    if(!ctx->ballers[i].shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        result = ctx->ballers[i].result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}